

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::AddExtraSites(S2Builder *this,MutableS2ShapeIndex *input_edge_index)

{
  InputEdgeId e_00;
  S1ChordAngle x;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  S1ChordAngle y;
  InputEdgeId e;
  value_type_conflict1 local_5c;
  undefined1 local_58 [4];
  InputEdgeId max_e;
  vector<int,_std::allocator<int>_> snap_queue;
  vector<int,_std::allocator<int>_> chain;
  MutableS2ShapeIndex *input_edge_index_local;
  S2Builder *this_local;
  
  x.length2_ = (this->site_snap_radius_ca_).length2_;
  y = S1ChordAngle::Zero();
  bVar1 = ::operator==(x,y);
  if (!bVar1) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &snap_queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_58);
    for (local_5c = 0; uVar2 = (ulong)local_5c,
        sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&this->input_edges_), uVar2 < sVar3; local_5c = local_5c + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_58,&local_5c);
      while (bVar1 = std::vector<int,_std::allocator<int>_>::empty
                               ((vector<int,_std::allocator<int>_> *)local_58),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::back
                           ((vector<int,_std::allocator<int>_> *)local_58);
        e_00 = *pvVar4;
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)local_58);
        SnapEdge(this,e_00,
                 (vector<int,_std::allocator<int>_> *)
                 &snap_queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
        MaybeAddExtraSites(this,e_00,local_5c,
                           (vector<int,_std::allocator<int>_> *)
                           &snap_queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,input_edge_index,
                           (vector<int,_std::allocator<int>_> *)local_58);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &snap_queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void S2Builder::AddExtraSites(const MutableS2ShapeIndex& input_edge_index) {
  // When options_.split_crossing_edges() is true, this function may be called
  // even when site_snap_radius_ca_ == 0 (because edge_snap_radius_ca_ > 0).
  // However neither of the conditions above apply in that case.
  if (site_snap_radius_ca_ == S1ChordAngle::Zero()) return;

  vector<SiteId> chain;  // Temporary
  vector<InputEdgeId> snap_queue;
  for (InputEdgeId max_e = 0; max_e < input_edges_.size(); ++max_e) {
    snap_queue.push_back(max_e);
    while (!snap_queue.empty()) {
      InputEdgeId e = snap_queue.back();
      snap_queue.pop_back();
      SnapEdge(e, &chain);
      // We could save the snapped chain here in a snapped_chains_ vector, to
      // avoid resnapping it in AddSnappedEdges() below, however currently
      // SnapEdge only accounts for less than 5% of the runtime.
      MaybeAddExtraSites(e, max_e, chain, input_edge_index, &snap_queue);
    }
  }
}